

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc_data.cpp
# Opt level: O3

void __thiscall NPC_Data::LoadShopDrop(NPC_Data *this)

{
  vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
  *this_00;
  vector<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>_>_>
  *this_01;
  vector<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
  *this_02;
  char cVar1;
  short sVar2;
  World *pWVar3;
  pointer puVar4;
  void *pvVar5;
  pointer puVar6;
  pointer puVar7;
  NPC_Shop_Craft_Item *__ptr;
  pointer puVar8;
  NPC_Citizenship *__ptr_00;
  _Head_base<0UL,_NPC_Citizenship_*,_false> _Var9;
  pointer pNVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  NPC_Data *pNVar16;
  default_delete<NPC_Citizenship> *pdVar17;
  int iVar18;
  int iVar19;
  iterator iVar20;
  undefined2 *puVar21;
  mapped_type *pmVar22;
  ENF_Data *pEVar23;
  long *plVar24;
  ushort *puVar25;
  NPC_Data *pNVar26;
  string *psVar27;
  Home *pHVar28;
  pointer pbVar29;
  size_type *psVar30;
  pointer pbVar31;
  int subject;
  int subject_00;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int subject_01;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  int extraout_EDX_10;
  ulong uVar32;
  long lVar33;
  uint uVar34;
  ulong uVar35;
  long lVar36;
  int ii;
  long lVar37;
  undefined8 *puVar38;
  _Hash_node_base *p_Var39;
  double dVar40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_> ingredients;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts_4;
  undefined1 local_108 [32];
  NPC_Data *local_e8;
  default_delete<NPC_Citizenship> *local_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
  local_d8;
  double local_78;
  undefined1 local_70 [32];
  string local_50;
  
  UnloadShopDrop(this);
  pWVar3 = this->world;
  local_e8 = this;
  util::to_string_abi_cxx11_(&local_d8.first,(util *)(ulong)(uint)(int)this->id,subject);
  iVar20 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&pWVar3->drops_config,&local_d8.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
    operator_delete(local_d8.first._M_dataplus._M_p,local_d8.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (iVar20.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
      ._M_cur == (__node_type *)0x0) {
LAB_0017caf7:
    pWVar3 = local_e8->world;
    local_d8.first._M_dataplus._M_p = (pointer)&local_d8.first.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Version","");
    pmVar22 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar3->shops_config,&local_d8.first);
    iVar18 = util::variant::GetInt(pmVar22);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
      operator_delete(local_d8.first._M_dataplus._M_p,
                      local_d8.first.field_2._M_allocated_capacity + 1);
    }
    pNVar16 = local_e8;
    pNVar26 = local_e8;
    if (1 < iVar18) {
      pEVar23 = ::ENF::Get(local_e8->world->enf,(int)local_e8->id);
      pNVar26 = (NPC_Data *)&pEVar23->vendor_id;
    }
    sVar2 = pNVar26->id;
    pEVar23 = ::ENF::Get(pNVar16->world->enf,(int)pNVar16->id);
    if ((pEVar23->type == Shop) && (0 < sVar2)) {
      uVar34 = (uint)sVar2;
      pWVar3 = local_e8->world;
      util::to_string_abi_cxx11_((string *)local_70,(util *)(ulong)uVar34,subject_00);
      plVar24 = (long *)std::__cxx11::string::append((char *)local_70);
      local_108._0_8_ = local_108 + 0x10;
      pbVar29 = (pointer)(plVar24 + 2);
      if ((pointer)*plVar24 == pbVar29) {
        local_108._16_8_ = (pbVar29->_M_dataplus)._M_p;
        local_108._24_8_ = plVar24[3];
      }
      else {
        local_108._16_8_ = (pbVar29->_M_dataplus)._M_p;
        local_108._0_8_ = (pointer)*plVar24;
      }
      local_108._8_8_ = plVar24[1];
      *plVar24 = (long)pbVar29;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      pmVar22 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&pWVar3->shops_config,(key_type *)local_108);
      util::variant::GetString_abi_cxx11_(&local_d8.first,pmVar22);
      std::__cxx11::string::operator=((string *)&local_e8->shop_name,(string *)&local_d8);
      iVar18 = extraout_EDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
        operator_delete(local_d8.first._M_dataplus._M_p,
                        local_d8.first.field_2._M_allocated_capacity + 1);
        iVar18 = extraout_EDX_00;
      }
      if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
        operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
        iVar18 = extraout_EDX_01;
      }
      if ((NPC_Shop_Craft_Item *)local_70._0_8_ != (NPC_Shop_Craft_Item *)(local_70 + 0x10)) {
        operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
        iVar18 = extraout_EDX_02;
      }
      pWVar3 = local_e8->world;
      util::to_string_abi_cxx11_((string *)local_108,(util *)(ulong)uVar34,iVar18);
      plVar24 = (long *)std::__cxx11::string::append(local_108);
      local_d8.first._M_dataplus._M_p = (pointer)&local_d8.first.field_2;
      psVar30 = (size_type *)(plVar24 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar24 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar30) {
        local_d8.first.field_2._M_allocated_capacity = *psVar30;
        local_d8.first.field_2._8_8_ = plVar24[3];
      }
      else {
        local_d8.first.field_2._M_allocated_capacity = *psVar30;
        local_d8.first._M_dataplus._M_p = (pointer)*plVar24;
      }
      local_d8.first._M_string_length = plVar24[1];
      *plVar24 = (long)psVar30;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      iVar20 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&pWVar3->shops_config,&local_d8.first);
      iVar18 = extraout_EDX_03;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
        operator_delete(local_d8.first._M_dataplus._M_p,
                        local_d8.first.field_2._M_allocated_capacity + 1);
        iVar18 = extraout_EDX_04;
      }
      if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
        operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
        iVar18 = extraout_EDX_05;
      }
      if (iVar20.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
          ._M_cur != (__node_type *)0x0) {
        util::variant::GetString_abi_cxx11_
                  (&local_d8.first,
                   (variant *)
                   ((long)iVar20.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                          ._M_cur + 0x28));
        util::explode((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_108,',',&local_d8.first);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
          operator_delete(local_d8.first._M_dataplus._M_p,
                          local_d8.first.field_2._M_allocated_capacity + 1);
        }
        uVar35 = (long)(local_108._8_8_ - local_108._0_8_) >> 5;
        if (1 < uVar35) {
          auVar11._8_8_ = 0;
          auVar11._0_8_ = uVar35;
          if (0x5555555555555555 < SUB168(auVar11 * ZEXT816(0xaaaaaaaaaaaaaaab),0)) {
            Console::Wrn("skipping invalid trade shop data for vendor #%i",(ulong)uVar34);
            goto LAB_0017d4dd;
          }
          this_01 = &local_e8->shop_trade;
          std::
          vector<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>_>_>
          ::resize(this_01,uVar35 / 3);
          if (local_108._8_8_ != local_108._0_8_) {
            lVar33 = 0;
            uVar35 = 0;
            do {
              uVar15 = local_108._0_8_;
              puVar25 = (ushort *)operator_new(0xc);
              iVar18 = util::to_int((string *)(uVar15 + lVar33));
              *puVar25 = (ushort)iVar18;
              iVar18 = util::to_int((string *)(local_108._0_8_ + lVar33 + 0x20));
              *(int *)(puVar25 + 2) = iVar18;
              iVar18 = util::to_int((string *)(local_108._0_8_ + lVar33 + 0x40));
              *(int *)(puVar25 + 4) = iVar18;
              if (((*(int *)(puVar25 + 2) < iVar18) && (iVar18 != 0)) &&
                 (*(int *)(puVar25 + 2) != 0)) {
                Console::Wrn("item #%i (vendor #%i) has a higher sell price than buy price.",
                             (ulong)*puVar25,(ulong)uVar34);
              }
              auVar12._8_8_ = 0;
              auVar12._0_8_ = uVar35;
              puVar6 = (this_01->
                       super__Vector_base<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              uVar32 = SUB168(auVar12 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0xfffffffffffffffe;
              pvVar5 = *(void **)((long)&(puVar6->_M_t).
                                         super___uniq_ptr_impl<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>
                                         ._M_t + uVar32 * 4);
              *(ushort **)
               ((long)&(puVar6->_M_t).
                       super___uniq_ptr_impl<NPC_Shop_Trade_Item,_std::default_delete<NPC_Shop_Trade_Item>_>
                       ._M_t + uVar32 * 4) = puVar25;
              if (pvVar5 != (void *)0x0) {
                operator_delete(pvVar5,0xc);
              }
              uVar35 = uVar35 + 3;
              lVar33 = lVar33 + 0x60;
            } while (uVar35 < (ulong)((long)(local_108._8_8_ - local_108._0_8_) >> 5));
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_108);
        iVar18 = extraout_EDX_06;
      }
      pWVar3 = local_e8->world;
      util::to_string_abi_cxx11_((string *)local_108,(util *)(ulong)uVar34,iVar18);
      plVar24 = (long *)std::__cxx11::string::append(local_108);
      local_d8.first._M_dataplus._M_p = (pointer)&local_d8.first.field_2;
      psVar30 = (size_type *)(plVar24 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar24 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar30) {
        local_d8.first.field_2._M_allocated_capacity = *psVar30;
        local_d8.first.field_2._8_8_ = plVar24[3];
      }
      else {
        local_d8.first.field_2._M_allocated_capacity = *psVar30;
        local_d8.first._M_dataplus._M_p = (pointer)*plVar24;
      }
      local_d8.first._M_string_length = plVar24[1];
      *plVar24 = (long)psVar30;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      iVar20 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&pWVar3->shops_config,&local_d8.first);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
        operator_delete(local_d8.first._M_dataplus._M_p,
                        local_d8.first.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
        operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
      }
      if (iVar20.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
          ._M_cur != (__node_type *)0x0) {
        util::variant::GetString_abi_cxx11_
                  (&local_d8.first,
                   (variant *)
                   ((long)iVar20.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                          ._M_cur + 0x28));
        util::explode((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_108,',',&local_d8.first);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
          operator_delete(local_d8.first._M_dataplus._M_p,
                          local_d8.first.field_2._M_allocated_capacity + 1);
        }
        uVar35 = (long)(local_108._8_8_ - local_108._0_8_) >> 5;
        if (1 < uVar35) {
          if (0x1c71c71c71c71c71 < uVar35 * -0x71c71c71c71c71c7) {
            Console::Wrn("skipping invalid craft shop data for vendor #%i",(ulong)uVar34);
            goto LAB_0017d4dd;
          }
          local_e0 = (default_delete<NPC_Citizenship> *)&local_e8->shop_craft;
          std::
          vector<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>_>_>
          ::resize((vector<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>_>_>
                    *)local_e0,uVar35 / 9);
          if (local_108._8_8_ != local_108._0_8_) {
            lVar33 = 0x20;
            uVar35 = 0;
            do {
              local_70._0_8_ = operator_new(0x20);
              *(char *)(local_70._0_8_ + 8) = '\0';
              *(char *)(local_70._0_8_ + 9) = '\0';
              *(char *)(local_70._0_8_ + 10) = '\0';
              *(char *)(local_70._0_8_ + 0xb) = '\0';
              *(char *)(local_70._0_8_ + 0xc) = '\0';
              *(char *)(local_70._0_8_ + 0xd) = '\0';
              *(char *)(local_70._0_8_ + 0xe) = '\0';
              *(char *)(local_70._0_8_ + 0xf) = '\0';
              *(char *)(local_70._0_8_ + 0x10) = '\0';
              *(char *)(local_70._0_8_ + 0x11) = '\0';
              *(char *)(local_70._0_8_ + 0x12) = '\0';
              *(char *)(local_70._0_8_ + 0x13) = '\0';
              *(char *)(local_70._0_8_ + 0x14) = '\0';
              *(char *)(local_70._0_8_ + 0x15) = '\0';
              *(char *)(local_70._0_8_ + 0x16) = '\0';
              *(char *)(local_70._0_8_ + 0x17) = '\0';
              *(char *)(local_70._0_8_ + 0x18) = '\0';
              *(char *)(local_70._0_8_ + 0x19) = '\0';
              *(char *)(local_70._0_8_ + 0x1a) = '\0';
              *(char *)(local_70._0_8_ + 0x1b) = '\0';
              *(char *)(local_70._0_8_ + 0x1c) = '\0';
              *(char *)(local_70._0_8_ + 0x1d) = '\0';
              *(char *)(local_70._0_8_ + 0x1e) = '\0';
              *(char *)(local_70._0_8_ + 0x1f) = '\0';
              local_d8.first.field_2._M_allocated_capacity = 0;
              local_d8.first._M_dataplus._M_p = (pointer)0x0;
              local_d8.first._M_string_length = 0;
              std::vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>::
              resize((vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>
                      *)&local_d8,4);
              iVar18 = util::to_int((string *)(local_108._0_8_ + uVar35 * 0x20));
              *(short *)local_70._0_8_ = (short)iVar18;
              lVar37 = 0;
              lVar36 = lVar33;
              do {
                iVar18 = util::to_int((string *)(local_108._0_8_ + lVar36));
                iVar19 = util::to_int((string *)(local_108._0_8_ + lVar36 + 0x20));
                *(short *)(local_d8.first._M_dataplus._M_p + lVar37 * 4) = (short)iVar18;
                local_d8.first._M_dataplus._M_p[lVar37 * 4 + 2] = (char)iVar19;
                lVar37 = lVar37 + 1;
                lVar36 = lVar36 + 0x40;
              } while (lVar37 != 4);
              std::vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>::
              operator=((vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>
                         *)(local_70._0_8_ + 8),
                        (vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>
                         *)&local_d8);
              uVar15 = local_70._0_8_;
              auVar13._8_8_ = 0;
              auVar13._0_8_ = uVar35;
              puVar7 = (((_Vector_base<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>,_std::allocator<std::unique_ptr<NPC_Shop_Craft_Item,_std::default_delete<NPC_Shop_Craft_Item>_>_>_>
                          *)&local_e0->field_0x0)->_M_impl).super__Vector_impl_data._M_start;
              uVar32 = SUB168(auVar13 * ZEXT816(0xe38e38e38e38e38f),8) & 0xfffffffffffffff8;
              local_70._0_8_ = (NPC_Shop_Craft_Item *)0x0;
              __ptr = *(NPC_Shop_Craft_Item **)((long)&puVar7->_M_t + uVar32);
              *(undefined8 *)((long)&puVar7->_M_t + uVar32) = uVar15;
              if (__ptr != (NPC_Shop_Craft_Item *)0x0) {
                std::default_delete<NPC_Shop_Craft_Item>::operator()
                          ((default_delete<NPC_Shop_Craft_Item> *)((long)&puVar7->_M_t + uVar32),
                           __ptr);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8.first._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_d8.first._M_dataplus._M_p,
                                local_d8.first.field_2._M_allocated_capacity -
                                (long)local_d8.first._M_dataplus._M_p);
              }
              if ((NPC_Shop_Craft_Item *)local_70._0_8_ != (NPC_Shop_Craft_Item *)0x0) {
                std::default_delete<NPC_Shop_Craft_Item>::operator()
                          ((default_delete<NPC_Shop_Craft_Item> *)local_70,
                           (NPC_Shop_Craft_Item *)local_70._0_8_);
              }
              uVar35 = uVar35 + 9;
              lVar33 = lVar33 + 0x120;
            } while (uVar35 < (ulong)((long)(local_108._8_8_ - local_108._0_8_) >> 5));
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_108);
      }
    }
    pWVar3 = local_e8->world;
    local_d8.first._M_dataplus._M_p = (pointer)&local_d8.first.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Version","");
    pmVar22 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar3->skills_config,&local_d8.first);
    iVar18 = util::variant::GetInt(pmVar22);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
      operator_delete(local_d8.first._M_dataplus._M_p,
                      local_d8.first.field_2._M_allocated_capacity + 1);
    }
    pNVar16 = local_e8;
    pNVar26 = local_e8;
    if (1 < iVar18) {
      pEVar23 = ::ENF::Get(local_e8->world->enf,(int)local_e8->id);
      pNVar26 = (NPC_Data *)&pEVar23->vendor_id;
    }
    sVar2 = pNVar26->id;
    pEVar23 = ::ENF::Get(pNVar16->world->enf,(int)pNVar16->id);
    if ((pEVar23->type == Skills) && (0 < sVar2)) {
      uVar34 = (uint)sVar2;
      pWVar3 = local_e8->world;
      util::to_string_abi_cxx11_((string *)local_70,(util *)(ulong)uVar34,subject_01);
      plVar24 = (long *)std::__cxx11::string::append((char *)local_70);
      pbVar29 = (pointer)(local_108 + 0x10);
      pbVar31 = (pointer)(plVar24 + 2);
      if ((pointer)*plVar24 == pbVar31) {
        local_108._16_8_ = (pbVar31->_M_dataplus)._M_p;
        local_108._24_8_ = plVar24[3];
        local_108._0_8_ = pbVar29;
      }
      else {
        local_108._16_8_ = (pbVar31->_M_dataplus)._M_p;
        local_108._0_8_ = (pointer)*plVar24;
      }
      local_108._8_8_ = plVar24[1];
      *plVar24 = (long)pbVar31;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      pmVar22 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&pWVar3->skills_config,(key_type *)local_108);
      util::variant::GetString_abi_cxx11_(&local_d8.first,pmVar22);
      std::__cxx11::string::operator=((string *)&local_e8->skill_name,(string *)&local_d8);
      iVar18 = extraout_EDX_07;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
        operator_delete(local_d8.first._M_dataplus._M_p,
                        local_d8.first.field_2._M_allocated_capacity + 1);
        iVar18 = extraout_EDX_08;
      }
      if ((pointer)local_108._0_8_ != pbVar29) {
        operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
        iVar18 = extraout_EDX_09;
      }
      if ((NPC_Shop_Craft_Item *)local_70._0_8_ != (NPC_Shop_Craft_Item *)(local_70 + 0x10)) {
        operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
        iVar18 = extraout_EDX_10;
      }
      pWVar3 = local_e8->world;
      util::to_string_abi_cxx11_((string *)local_108,(util *)(ulong)uVar34,iVar18);
      plVar24 = (long *)std::__cxx11::string::append(local_108);
      local_d8.first._M_dataplus._M_p = (pointer)&local_d8.first.field_2;
      psVar30 = (size_type *)(plVar24 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar24 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar30) {
        local_d8.first.field_2._M_allocated_capacity = *psVar30;
        local_d8.first.field_2._8_8_ = plVar24[3];
      }
      else {
        local_d8.first.field_2._M_allocated_capacity = *psVar30;
        local_d8.first._M_dataplus._M_p = (pointer)*plVar24;
      }
      local_d8.first._M_string_length = plVar24[1];
      *plVar24 = (long)psVar30;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      iVar20 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&pWVar3->skills_config,&local_d8.first);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
        operator_delete(local_d8.first._M_dataplus._M_p,
                        local_d8.first.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_108._0_8_ != pbVar29) {
        operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
      }
      if (iVar20.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
          ._M_cur != (__node_type *)0x0) {
        util::variant::GetString_abi_cxx11_
                  (&local_d8.first,
                   (variant *)
                   ((long)iVar20.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                          ._M_cur + 0x28));
        util::explode((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_108,',',&local_d8.first);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
          operator_delete(local_d8.first._M_dataplus._M_p,
                          local_d8.first.field_2._M_allocated_capacity + 1);
        }
        uVar35 = (long)(local_108._8_8_ - local_108._0_8_) >> 5;
        if (1 < uVar35) {
          if (0x1249249249249249 <
              (uVar35 * 0x6db6db6db6db6db7 >> 1 |
              (ulong)((uVar35 * 0x6db6db6db6db6db7 & 1) != 0) << 0x3f)) {
            Console::Err("WARNING: skipping invalid skill learn data for vendor #%i",(ulong)uVar34);
            goto LAB_0017d4dd;
          }
          this_02 = &local_e8->skill_learn;
          std::
          vector<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
          ::resize(this_02,uVar35 / 0xe);
          if (local_108._8_8_ != local_108._0_8_) {
            lVar33 = 0;
            uVar35 = 0;
            do {
              uVar15 = local_108._0_8_;
              puVar21 = (undefined2 *)operator_new(0x20);
              iVar18 = util::to_int((string *)(uVar15 + lVar33));
              *puVar21 = (short)iVar18;
              iVar18 = util::to_int((string *)(local_108._0_8_ + lVar33 + 0x20));
              *(int *)(puVar21 + 2) = iVar18;
              iVar18 = util::to_int((string *)(local_108._0_8_ + lVar33 + 0x40));
              *(char *)(puVar21 + 4) = (char)iVar18;
              iVar18 = util::to_int((string *)(local_108._0_8_ + lVar33 + 0x60));
              *(char *)((long)puVar21 + 9) = (char)iVar18;
              iVar18 = util::to_int((string *)(local_108._0_8_ + lVar33 + 0x80));
              puVar21[5] = (short)iVar18;
              iVar18 = util::to_int((string *)(local_108._0_8_ + lVar33 + 0xa0));
              puVar21[6] = (short)iVar18;
              iVar18 = util::to_int((string *)(local_108._0_8_ + lVar33 + 0xc0));
              puVar21[7] = (short)iVar18;
              iVar18 = util::to_int((string *)(local_108._0_8_ + lVar33 + 0xe0));
              puVar21[8] = (short)iVar18;
              iVar18 = util::to_int((string *)(local_108._0_8_ + lVar33 + 0x100));
              puVar21[9] = (short)iVar18;
              iVar18 = util::to_int((string *)(local_108._0_8_ + lVar33 + 0x120));
              puVar21[10] = (short)iVar18;
              iVar18 = util::to_int((string *)(local_108._0_8_ + lVar33 + 0x140));
              puVar21[0xb] = (short)iVar18;
              iVar18 = util::to_int((string *)(local_108._0_8_ + lVar33 + 0x160));
              puVar21[0xc] = (short)iVar18;
              iVar18 = util::to_int((string *)(local_108._0_8_ + lVar33 + 0x180));
              puVar21[0xd] = (short)iVar18;
              iVar18 = util::to_int((string *)(local_108._0_8_ + lVar33 + 0x1a0));
              puVar21[0xe] = (short)iVar18;
              auVar14._8_8_ = 0;
              auVar14._0_8_ = uVar35 >> 1;
              puVar8 = (this_02->
                       super__Vector_base<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              uVar32 = SUB168(auVar14 * ZEXT816(0x4924924924924925),8) & 0xfffffffffffffffe;
              pvVar5 = *(void **)((long)&(puVar8->_M_t).
                                         super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                         ._M_t + uVar32 * 4);
              *(undefined2 **)
               ((long)&(puVar8->_M_t).
                       super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                       ._M_t + uVar32 * 4) = puVar21;
              if (pvVar5 != (void *)0x0) {
                operator_delete(pvVar5,0x20);
              }
              uVar35 = uVar35 + 0xe;
              lVar33 = lVar33 + 0x1c0;
            } while (uVar35 < (ulong)((long)(local_108._8_8_ - local_108._0_8_) >> 5));
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_108);
      }
    }
    pWVar3 = local_e8->world;
    local_d8.first._M_dataplus._M_p = (pointer)&local_d8.first.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Version","");
    pmVar22 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar3->home_config,&local_d8.first);
    iVar18 = util::variant::GetInt(pmVar22);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
      operator_delete(local_d8.first._M_dataplus._M_p,
                      local_d8.first.field_2._M_allocated_capacity + 1);
    }
    pNVar16 = local_e8;
    pNVar26 = local_e8;
    if (1 < iVar18) {
      pEVar23 = ::ENF::Get(local_e8->world->enf,(int)local_e8->id);
      pNVar26 = (NPC_Data *)&pEVar23->vendor_id;
    }
    sVar2 = pNVar26->id;
    pEVar23 = ::ENF::Get(pNVar16->world->enf,(int)pNVar16->id);
    if (((pEVar23->type == Inn) && (0 < sVar2)) &&
       (p_Var39 = (local_e8->world->home_config).
                  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                  ._M_h._M_before_begin._M_nxt, p_Var39 != (_Hash_node_base *)0x0)) {
      local_78 = (double)CONCAT44(local_78._4_4_,(int)sVar2);
      local_e0 = (default_delete<NPC_Citizenship> *)&local_e8->citizenship;
      do {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
        ::pair(&local_d8,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
                *)(p_Var39 + 1));
        util::explode((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_70,'.',&local_d8.first);
        pdVar17 = local_e0;
        iVar18 = 0x13;
        if (0x20 < (ulong)(local_70._8_8_ - local_70._0_8_)) {
          puVar38 = *(undefined8 **)local_e0;
          if (puVar38 == (undefined8 *)0x0) {
            iVar18 = std::__cxx11::string::compare((char *)(local_70._0_8_ + 0x20));
            if (iVar18 == 0) {
              util::variant::GetString_abi_cxx11_((string *)local_108,&local_d8.second);
              iVar18 = util::to_int((string *)local_108);
              if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
                operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
              }
              if (iVar18 == local_78._0_4_) {
                psVar27 = (string *)operator_new(0xe0);
                *(string **)psVar27 = psVar27 + 0x10;
                *(long *)(psVar27 + 8) = 0;
                psVar27[0x10] = (string)0x0;
                lVar33 = 0x30;
                do {
                  *(string **)(psVar27 + lVar33 + -0x10) = psVar27 + lVar33;
                  *(undefined8 *)(psVar27 + lVar33 + -8) = 0;
                  psVar27[lVar33] = (string)0x0;
                  lVar33 = lVar33 + 0x20;
                } while (lVar33 != 0x90);
                lVar33 = 0x90;
                do {
                  *(string **)(psVar27 + lVar33 + -0x10) = psVar27 + lVar33;
                  *(undefined8 *)(psVar27 + lVar33 + -8) = 0;
                  psVar27[lVar33] = (string)0x0;
                  lVar33 = lVar33 + 0x20;
                } while (lVar33 != 0xf0);
                __ptr_00 = *(NPC_Citizenship **)pdVar17;
                *(string **)pdVar17 = psVar27;
                if (__ptr_00 != (NPC_Citizenship *)0x0) {
                  std::default_delete<NPC_Citizenship>::operator()(pdVar17,__ptr_00);
                  psVar27 = *(string **)pdVar17;
                }
                std::__cxx11::string::_M_assign(psVar27);
                _Var9._M_head_impl =
                     (local_e8->citizenship)._M_t.
                     super___uniq_ptr_impl<NPC_Citizenship,_std::default_delete<NPC_Citizenship>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_NPC_Citizenship_*,_std::default_delete<NPC_Citizenship>_>
                     .super__Head_base<0UL,_NPC_Citizenship_*,_false>._M_head_impl;
                pWVar3 = local_e8->world;
                local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                lVar33 = *(long *)&(_Var9._M_head_impl)->home;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_50,lVar33,
                           *(size_type *)((long)&(_Var9._M_head_impl)->home + 8) + lVar33);
                pHVar28 = World::GetHome(pWVar3,&local_50);
                pdVar17 = local_e0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
                if (pHVar28 == (Home *)0x0) {
                  Console::Wrn("Vendor #%i\'s innkeeper set on non-existent home: %s",
                               (ulong)local_78 & 0xffffffff,
                               *(undefined8 *)
                                *(__uniq_ptr_data<NPC_Citizenship,_std::default_delete<NPC_Citizenship>,_true,_true>
                                  *)pdVar17);
                  iVar18 = 0x11;
                }
                else {
                  pEVar23 = ::ENF::Get(local_e8->world->enf,(int)local_e8->id);
                  pHVar28->innkeeper_vend = (int)pEVar23->vendor_id;
                  iVar18 = 0x11;
                }
                goto LAB_0017db78;
              }
            }
            puVar38 = *(undefined8 **)pdVar17;
            if (puVar38 != (undefined8 *)0x0) goto LAB_0017d9c8;
          }
          else {
LAB_0017d9c8:
            uVar15 = local_70._0_8_;
            pNVar10 = (pointer)puVar38[1];
            if ((pNVar10 ==
                 (((vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_> *)
                  (local_70._0_8_ + 8))->
                 super__Vector_base<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>
                 )._M_impl.super__Vector_impl_data._M_start) &&
               ((pNVar10 == (pointer)0x0 ||
                (iVar18 = bcmp((void *)*puVar38,*(void **)local_70._0_8_,(size_t)pNVar10),
                iVar18 == 0)))) {
              std::__cxx11::string::substr((ulong)local_108,(ulong)(uVar15 + 0x20));
              iVar18 = std::__cxx11::string::compare(local_108);
              if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
                operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
              }
              if (iVar18 == 0) {
                cVar1 = *(char *)(*(long *)(local_70._0_8_ + 0x20) + -1 +
                                 (long)(((vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>
                                          *)(local_70._0_8_ + 0x28))->
                                       super__Vector_base<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>
                                       )._M_impl.super__Vector_impl_data._M_start);
                if ((byte)(cVar1 - 0x34U) < 0xfd) {
                  util::variant::GetString_abi_cxx11_((string *)local_108,&local_d8.second);
                  Console::Wrn("Exactly 3 questions must be specified for %s innkeeper vendor #%i",
                               local_108._0_8_,(ulong)local_78 & 0xffffffff);
                  if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
                    operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
                  }
                }
                util::variant::GetString_abi_cxx11_((string *)local_108,&local_d8.second);
                std::__cxx11::string::operator=
                          ((string *)
                           ((long)*(__uniq_ptr_data<NPC_Citizenship,_std::default_delete<NPC_Citizenship>,_true,_true>
                                    *)local_e0 + ((long)cVar1 + -0x31) * 0x20 + 0x20),
                           (string *)local_108);
                if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
                  operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
                }
                iVar18 = 0;
                goto LAB_0017db78;
              }
              puVar38 = *(undefined8 **)pdVar17;
              if (puVar38 == (undefined8 *)0x0) goto LAB_0017db75;
            }
            uVar15 = local_70._0_8_;
            pNVar10 = (pointer)puVar38[1];
            if ((pNVar10 ==
                 (((vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_> *)
                  (local_70._0_8_ + 8))->
                 super__Vector_base<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>
                 )._M_impl.super__Vector_impl_data._M_start) &&
               ((pNVar10 == (pointer)0x0 ||
                (iVar18 = bcmp((void *)*puVar38,*(void **)local_70._0_8_,(size_t)pNVar10),
                iVar18 == 0)))) {
              std::__cxx11::string::substr((ulong)local_108,(ulong)(uVar15 + 0x20));
              iVar19 = std::__cxx11::string::compare(local_108);
              if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
                operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
              }
              iVar18 = 0;
              if (iVar19 == 0) {
                cVar1 = *(char *)(*(long *)(local_70._0_8_ + 0x20) + -1 +
                                 (long)(((vector<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>
                                          *)(local_70._0_8_ + 0x28))->
                                       super__Vector_base<NPC_Shop_Craft_Ingredient,_std::allocator<NPC_Shop_Craft_Ingredient>_>
                                       )._M_impl.super__Vector_impl_data._M_start);
                if ((byte)(cVar1 - 0x34U) < 0xfd) {
                  util::variant::GetString_abi_cxx11_((string *)local_108,&local_d8.second);
                  Console::Wrn("Exactly 3 answers must be specified for %s innkeeper vendor #%i",
                               local_108._0_8_,(ulong)local_78 & 0xffffffff);
                  if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
                    operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
                  }
                }
                util::variant::GetString_abi_cxx11_((string *)local_108,&local_d8.second);
                std::__cxx11::string::operator=
                          ((string *)
                           ((long)*(__uniq_ptr_data<NPC_Citizenship,_std::default_delete<NPC_Citizenship>,_true,_true>
                                    *)local_e0 + ((long)cVar1 + -0x31) * 0x20 + 0x80),
                           (string *)local_108);
                iVar18 = 0;
                if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
                  operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
                  iVar18 = 0;
                }
              }
              goto LAB_0017db78;
            }
          }
LAB_0017db75:
          iVar18 = 0;
        }
LAB_0017db78:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8.second.val_string._M_dataplus._M_p != &local_d8.second.val_string.field_2) {
          operator_delete(local_d8.second.val_string._M_dataplus._M_p,
                          local_d8.second.val_string.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
          operator_delete(local_d8.first._M_dataplus._M_p,
                          local_d8.first.field_2._M_allocated_capacity + 1);
        }
        if ((iVar18 == 0x13) || (iVar18 == 0)) {
          p_Var39 = p_Var39->_M_nxt;
        }
        else {
          p_Var39 = (local_e8->world->home_config).
                    super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                    ._M_h._M_before_begin._M_nxt;
        }
      } while (p_Var39 != (_Hash_node_base *)0x0);
    }
  }
  else {
    util::variant::GetString_abi_cxx11_
              (&local_d8.first,
               (variant *)
               ((long)iVar20.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                      ._M_cur + 0x28));
    util::explode((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_108,',',&local_d8.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
      operator_delete(local_d8.first._M_dataplus._M_p,
                      local_d8.first.field_2._M_allocated_capacity + 1);
    }
    uVar35 = (long)(local_108._8_8_ - local_108._0_8_) >> 5;
    if (uVar35 < 2) {
LAB_0017caef:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_108);
      goto LAB_0017caf7;
    }
    if ((local_108._8_8_ - local_108._0_8_ & 0x60) == 0) {
      this_00 = &local_e8->drops;
      std::
      vector<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
      ::resize(this_00,uVar35 >> 2);
      if (local_108._8_8_ != local_108._0_8_) {
        local_e0 = (default_delete<NPC_Citizenship> *)0x0;
        lVar33 = 0;
        uVar35 = 0;
        do {
          uVar15 = local_108._0_8_;
          puVar21 = (undefined2 *)operator_new(0x20);
          iVar18 = util::to_int((string *)(uVar15 + lVar33));
          *puVar21 = (short)iVar18;
          iVar18 = util::to_int((string *)(local_108._0_8_ + lVar33 + 0x20));
          *(int *)(puVar21 + 2) = iVar18;
          iVar18 = util::to_int((string *)(local_108._0_8_ + lVar33 + 0x40));
          *(int *)(puVar21 + 4) = iVar18;
          dVar40 = util::to_float((string *)(local_108._0_8_ + lVar33 + 0x60));
          *(double *)(puVar21 + 8) = dVar40;
          *(default_delete<NPC_Citizenship> **)(puVar21 + 0xc) = local_e0;
          puVar4 = (this_00->
                   super__Vector_base<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>,_std::allocator<std::unique_ptr<NPC_Drop,_std::default_delete<NPC_Drop>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pvVar5 = *(void **)((long)&(puVar4->_M_t).
                                     super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>
                                     ._M_t + uVar35 * 2);
          *(undefined2 **)
           ((long)&(puVar4->_M_t).super___uniq_ptr_impl<NPC_Drop,_std::default_delete<NPC_Drop>_>.
                   _M_t + uVar35 * 2) = puVar21;
          if (pvVar5 != (void *)0x0) {
            local_78 = dVar40;
            operator_delete(pvVar5,0x20);
            dVar40 = local_78;
          }
          local_e0 = (default_delete<NPC_Citizenship> *)((double)local_e0 + dVar40);
          uVar35 = uVar35 + 4;
          lVar33 = lVar33 + 0x80;
        } while (uVar35 < (ulong)((long)(local_108._8_8_ - local_108._0_8_) >> 5));
        if (100.001 < (double)local_e0) {
          local_e8->drops_chance_total = (double)local_e0;
          pWVar3 = local_e8->world;
          local_d8.first._M_dataplus._M_p = (pointer)&local_d8.first.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"DropRateMode","");
          pmVar22 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&pWVar3->config,&local_d8.first);
          iVar18 = util::variant::GetInt(pmVar22);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8.first._M_dataplus._M_p != &local_d8.first.field_2) {
            operator_delete(local_d8.first._M_dataplus._M_p,
                            local_d8.first.field_2._M_allocated_capacity + 1);
          }
          if (iVar18 == 3) {
            Console::Wrn("Drop rates for NPC #%i add up to %g%%. They have been scaled down proportionally."
                         ,local_e8->drops_chance_total,(ulong)(uint)(int)local_e8->id);
          }
          goto LAB_0017caef;
        }
      }
      local_e8->drops_chance_total = 100.0;
      goto LAB_0017caef;
    }
    Console::Wrn("skipping invalid drop data for NPC #%i",(ulong)(uint)(int)local_e8->id);
LAB_0017d4dd:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_108);
  }
  return;
}

Assistant:

void NPC_Data::LoadShopDrop()
{
	this->UnloadShopDrop();

	Config::iterator drops = this->world->drops_config.find(util::to_string(this->id));
	if (drops != this->world->drops_config.end())
	{
		std::vector<std::string> parts = util::explode(',', static_cast<std::string>((*drops).second));

		if (parts.size() > 1)
		{
			if (parts.size() % 4 != 0)
			{
				Console::Wrn("skipping invalid drop data for NPC #%i", id);
				return;
			}

			double chance_offset = 0.0;

			this->drops.resize(parts.size() / 4);

			for (std::size_t i = 0; i < parts.size(); i += 4)
			{
				std::unique_ptr<NPC_Drop> drop(new NPC_Drop);

				drop->id = util::to_int(parts[i]);
				drop->min = util::to_int(parts[i+1]);
				drop->max = util::to_int(parts[i+2]);
				drop->chance = util::to_float(parts[i+3]);
				drop->chance_offset = chance_offset;

				chance_offset += drop->chance;

				this->drops[i/4] = std::move(drop);
			}

			if (chance_offset > 100.001)
			{
				this->drops_chance_total = chance_offset;

				if (static_cast<int>(this->world->config["DropRateMode"]) == 3)
					Console::Wrn("Drop rates for NPC #%i add up to %g%%. They have been scaled down proportionally.", this->id, this->drops_chance_total);
			}
			else
			{
				this->drops_chance_total = 100.0;
			}
		}
	}

	short shop_vend_id;

	if (int(this->world->shops_config["Version"]) < 2)
	{
		shop_vend_id = this->id;
	}
	else
	{
		shop_vend_id = this->ENF().vendor_id;
	}

	if (this->ENF().type == ENF::Type::Shop && shop_vend_id > 0)
	{
		this->shop_name = static_cast<std::string>(this->world->shops_config[util::to_string(shop_vend_id) + ".name"]);
		Config::iterator shops = this->world->shops_config.find(util::to_string(shop_vend_id) + ".trade");
		if (shops != this->world->shops_config.end())
		{
			std::vector<std::string> parts = util::explode(',', static_cast<std::string>((*shops).second));

			if (parts.size() > 1)
			{
				if (parts.size() % 3 != 0)
				{
					Console::Wrn("skipping invalid trade shop data for vendor #%i", shop_vend_id);
					return;
				}

				this->shop_trade.resize(parts.size() / 3);

				for (std::size_t i = 0; i < parts.size(); i += 3)
				{
					std::unique_ptr<NPC_Shop_Trade_Item> item(new NPC_Shop_Trade_Item);
					item->id = util::to_int(parts[i]);
					item->buy = util::to_int(parts[i+1]);
					item->sell = util::to_int(parts[i+2]);

					if (item->buy != 0 && item->sell != 0 && item->sell > item->buy)
					{
						Console::Wrn("item #%i (vendor #%i) has a higher sell price than buy price.", item->id, shop_vend_id);
					}

					this->shop_trade[i/3] = std::move(item);
				}
			}
		}

		shops = this->world->shops_config.find(util::to_string(shop_vend_id) + ".craft");
		if (shops != this->world->shops_config.end())
		{
			std::vector<std::string> parts = util::explode(',', static_cast<std::string>((*shops).second));

			if (parts.size() > 1)
			{
				if (parts.size() % 9 != 0)
				{
					Console::Wrn("skipping invalid craft shop data for vendor #%i", shop_vend_id);
					return;
				}

				this->shop_craft.resize(parts.size() / 9);

				for (std::size_t i = 0; i < parts.size(); i += 9)
				{
					std::unique_ptr<NPC_Shop_Craft_Item> item(new NPC_Shop_Craft_Item);
					std::vector<NPC_Shop_Craft_Ingredient> ingredients;
					ingredients.resize(4);

					item->id = util::to_int(parts[i]);

					for (int ii = 0; ii < 4; ++ii)
					{
						NPC_Shop_Craft_Ingredient ingredient;
						ingredient.id = util::to_int(parts[i+1+ii*2]);
						ingredient.amount = util::to_int(parts[i+2+ii*2]);
						ingredients[ii] = ingredient;
					}

					item->ingredients = ingredients;

					this->shop_craft[i/9] = std::move(item);
				}
			}
		}
	}

	short skills_vend_id;

	if (int(this->world->skills_config["Version"]) < 2)
	{
		skills_vend_id = this->id;
	}
	else
	{
		skills_vend_id = this->ENF().vendor_id;
	}

	if (this->ENF().type == ENF::Type::Skills && skills_vend_id > 0)
	{
		this->skill_name = static_cast<std::string>(this->world->skills_config[util::to_string(skills_vend_id) + ".name"]);
		Config::iterator skills = this->world->skills_config.find(util::to_string(skills_vend_id) + ".learn");
		if (skills != this->world->skills_config.end())
		{
			std::vector<std::string> parts = util::explode(',', static_cast<std::string>((*skills).second));

			if (parts.size() > 1)
			{
				if (parts.size() % 14 != 0)
				{
					Console::Err("WARNING: skipping invalid skill learn data for vendor #%i", skills_vend_id);
					return;
				}

				this->skill_learn.resize(parts.size() / 14);

				for (std::size_t i = 0; i < parts.size(); i += 14)
				{
					std::unique_ptr<NPC_Learn_Skill> skill(new NPC_Learn_Skill);

					skill->id = util::to_int(parts[i]);
					skill->cost = util::to_int(parts[i+1]);
					skill->levelreq = util::to_int(parts[i+2]);
					skill->classreq = util::to_int(parts[i+3]);

					skill->skillreq[0] = util::to_int(parts[i+4]);
					skill->skillreq[1] = util::to_int(parts[i+5]);
					skill->skillreq[2] = util::to_int(parts[i+6]);
					skill->skillreq[3] = util::to_int(parts[i+7]);

					skill->strreq = util::to_int(parts[i+8]);
					skill->intreq = util::to_int(parts[i+9]);
					skill->wisreq = util::to_int(parts[i+10]);
					skill->agireq = util::to_int(parts[i+11]);
					skill->conreq = util::to_int(parts[i+12]);
					skill->chareq = util::to_int(parts[i+13]);

					this->skill_learn[i/14] = std::move(skill);
				}
			}
		}
	}

	short home_vend_id;

	if (int(this->world->home_config["Version"]) < 2)
	{
		home_vend_id = this->id;
	}
	else
	{
		home_vend_id = this->ENF().vendor_id;
	}

	if (this->ENF().type == ENF::Type::Inn && home_vend_id > 0)
	{
		restart_loop:
		UTIL_FOREACH(this->world->home_config, hc)
		{
			std::vector<std::string> parts = util::explode('.', hc.first);

			if (parts.size() < 2)
			{
				continue;
			}

			if (!this->citizenship && parts[1] == "innkeeper" && util::to_int(hc.second) == home_vend_id)
			{
				this->citizenship.reset(new NPC_Citizenship);
				this->citizenship->home = parts[0];
				Home* home = this->world->GetHome(this->citizenship->home);

				if (home)
					home->innkeeper_vend = this->ENF().vendor_id;
				else
					Console::Wrn("Vendor #%i's innkeeper set on non-existent home: %s", home_vend_id, this->citizenship->home.c_str());

				// Restart the loop so questions/answers specified before the innkeeper option will load
				goto restart_loop;
			}
			else if (this->citizenship && this->citizenship->home == parts[0] && parts[1].substr(0, parts[1].length() - 1) == "question")
			{
				int index = parts[1][parts[1].length() - 1] - '1';

				if (index < 0 || index >= 3)
				{
					Console::Wrn("Exactly 3 questions must be specified for %s innkeeper vendor #%i", std::string(hc.second).c_str(), home_vend_id);
				}

				this->citizenship->questions[index] = static_cast<std::string>(hc.second);
			}
			else if (this->citizenship && this->citizenship->home == parts[0] && parts[1].substr(0, parts[1].length() - 1) == "answer")
			{
				int index = parts[1][parts[1].length() - 1] - '1';

				if (index < 0 || index >= 3)
				{
					Console::Wrn("Exactly 3 answers must be specified for %s innkeeper vendor #%i", std::string(hc.second).c_str(), home_vend_id);
				}

				this->citizenship->answers[index] = static_cast<std::string>(hc.second);
			}
		}
	}
}